

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rans_symbol_decoder.h
# Opt level: O1

bool __thiscall
draco::RAnsSymbolDecoder<4>::StartDecoding(RAnsSymbolDecoder<4> *this,DecoderBuffer *buffer)

{
  long lVar1;
  byte bVar2;
  bool bVar3;
  ulong in_RAX;
  ulong uVar4;
  uint8_t *puVar5;
  uint uVar6;
  uint uVar7;
  uint64_t bytes_encoded;
  ulong local_18;
  
  if (buffer->bitstream_version_ < 0x200) {
    lVar1 = buffer->pos_ + 8;
    if (buffer->data_size_ < lVar1) {
      return false;
    }
    local_18 = *(ulong *)(buffer->data_ + buffer->pos_);
    buffer->pos_ = lVar1;
  }
  else {
    local_18 = in_RAX;
    bVar3 = anon_unknown_52::DecodeVarintUnsigned<unsigned_long>(1,&local_18,buffer);
    if (!bVar3) {
      return false;
    }
  }
  lVar1 = buffer->pos_;
  if (local_18 <= (ulong)(buffer->data_size_ - lVar1)) {
    puVar5 = (uint8_t *)(buffer->data_ + lVar1);
    buffer->pos_ = lVar1 + local_18;
    uVar6 = (uint)local_18;
    if (0 < (int)uVar6) {
      (this->ans_).ans_.buf = puVar5;
      uVar7 = uVar6 - 1;
      if (puVar5[uVar7] < 0x40) {
        (this->ans_).ans_.buf_offset = uVar7;
        uVar6 = puVar5[uVar7] & 0x3f;
      }
      else {
        bVar2 = puVar5[uVar7] >> 6;
        if (bVar2 == 2) {
          if ((int)uVar6 < 3) {
            return false;
          }
          (this->ans_).ans_.buf_offset = uVar6 - 3;
          uVar4 = (ulong)(uVar6 & 0x7fffffff);
          uVar7 = (uint)puVar5[uVar4 - 3];
          uVar6 = (puVar5[uVar4 - 1] & 0x3f) << 0x10 | (uint)puVar5[uVar4 - 2] << 8;
        }
        else if (bVar2 == 1) {
          if (uVar6 == 1) {
            return false;
          }
          (this->ans_).ans_.buf_offset = uVar6 - 2;
          uVar7 = (uint)puVar5[(ulong)(uVar6 & 0x7fffffff) - 2];
          uVar6 = (puVar5[(ulong)(uVar6 & 0x7fffffff) - 1] & 0x3f) << 8;
        }
        else {
          (this->ans_).ans_.buf_offset = uVar6 - 4;
          uVar4 = (ulong)(uVar6 & 0x7fffffff);
          uVar7 = (uint)puVar5[uVar4 - 4];
          uVar6 = (puVar5[uVar4 - 1] & 0x3f) << 0x18 | (uint)puVar5[uVar4 - 2] << 0x10 |
                  (uint)puVar5[uVar4 - 3] << 8;
        }
        uVar6 = uVar6 | uVar7;
      }
      (this->ans_).ans_.state = uVar6 + 0x4000;
      return uVar6 + 0x4000 < 0x400000;
    }
  }
  return false;
}

Assistant:

bool RAnsSymbolDecoder<unique_symbols_bit_length_t>::StartDecoding(
    DecoderBuffer *buffer) {
  uint64_t bytes_encoded;
  // Decode the number of bytes encoded by the encoder.
#ifdef DRACO_BACKWARDS_COMPATIBILITY_SUPPORTED
  if (buffer->bitstream_version() < DRACO_BITSTREAM_VERSION(2, 0)) {
    if (!buffer->Decode(&bytes_encoded)) {
      return false;
    }

  } else
#endif
  {
    if (!DecodeVarint<uint64_t>(&bytes_encoded, buffer)) {
      return false;
    }
  }
  if (bytes_encoded > static_cast<uint64_t>(buffer->remaining_size())) {
    return false;
  }
  const uint8_t *const data_head =
      reinterpret_cast<const uint8_t *>(buffer->data_head());
  // Advance the buffer past the rANS data.
  buffer->Advance(bytes_encoded);
  if (ans_.read_init(data_head, static_cast<int>(bytes_encoded)) != 0) {
    return false;
  }
  return true;
}